

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O2

int lyd_toprint(lyd_node *node,int options)

{
  lyd_node *plVar1;
  int iVar2;
  lys_node *node_00;
  lys_node *plVar3;
  lys_module *plVar4;
  lyd_node *node_01;
  
  iVar2 = lyd_wd_toprint(node,options);
  if (iVar2 != 0) {
    return 1;
  }
  node_00 = node->schema;
  do {
    node_00 = lys_parent(node_00);
    if (node_00 == (lys_node *)0x0) {
      return 0;
    }
  } while (node_00->nodetype == LYS_USES);
  plVar3 = node_00;
  if (node_00->nodetype == LYS_CASE) {
    do {
      plVar3 = lys_parent(plVar3);
      if (plVar3 == (lys_node *)0x0) goto LAB_0016c805;
    } while (plVar3->nodetype == LYS_USES);
    if (plVar3->nodetype != LYS_CHOICE) {
LAB_0016c805:
      plVar4 = lyd_node_module(node);
      ly_log(plVar4->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer.c"
             ,0x3cb);
      return 0;
    }
    if ((lys_node *)plVar3[1].name != node_00) {
      plVar1 = node->prev;
      do {
        node_01 = plVar1;
        plVar1 = node_01->prev;
      } while (node_01->prev->next != (lyd_node *)0x0);
      do {
        if (node_01 == (lyd_node *)0x0) {
          return 1;
        }
        if (node_01 != node) {
          plVar3 = node_01->schema;
          do {
            plVar3 = lys_parent(plVar3);
            if (plVar3 == (lys_node *)0x0) break;
          } while (plVar3->nodetype == LYS_USES);
          if ((plVar3 == node_00) && (iVar2 = lyd_wd_toprint(node_01,options), iVar2 != 0)) {
            return 0;
          }
        }
        node_01 = node_01->next;
      } while( true );
    }
  }
  return 0;
}

Assistant:

int
lyd_toprint(const struct lyd_node *node, int options)
{
    struct lys_node *scase, *sparent;
    struct lyd_node *first;

    if (!lyd_wd_toprint(node, options)) {
        /* wd says do not print, but make exception for direct descendants of case nodes without other printable nodes */
        for (sparent = lys_parent(node->schema); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
        if (!sparent || (sparent->nodetype != LYS_CASE)) {
            /* parent not a case */
            return 0;
        }
        scase = sparent;

        for (sparent = lys_parent(scase); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
        if (!sparent || (sparent->nodetype != LYS_CHOICE)) {
            /* weird */
            LOGINT(lyd_node_module(node)->ctx);
            return 0;
        }
        if (((struct lys_node_choice *)sparent)->dflt == scase) {
            /* this is a default case, respect the previous original toprint flag */
            return 0;
        }

        /* try to find a sibling that will be printed */
        for (first = node->prev; first->prev->next; first = first->prev);
        LY_TREE_FOR(first, first) {
            if (first == node) {
                /* skip this node */
                continue;
            }

            /* find schema parent, whether it is the same case */
            for (sparent = lys_parent(first->schema); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
            if ((sparent == scase) && lyd_wd_toprint(first, options)) {
                /* this other node will be printed, we do not have to print the current one */
                return 0;
            }
        }

        /* there is no case child that will be printed, print this node */
        return 1;
    }

    return 1;
}